

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O2

UText * __thiscall
icu_63::RegexMatcher::appendTail(RegexMatcher *this,UText *dest,UErrorCode *status)

{
  long limit;
  UText *ut;
  int32_t destCapacity;
  int64_t iVar1;
  UChar *dest_00;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fDeferredStatus < U_ILLEGAL_ARGUMENT_ERROR) {
      limit = this->fInputLength;
      iVar1 = this->fAppendPosition;
      if (iVar1 < limit) {
        ut = this->fInputText;
        if (((ut->chunkNativeStart == 0) && (limit == ut->chunkNativeLimit)) &&
           (limit == ut->nativeIndexingLimit)) {
          iVar1 = utext_nativeLength_63(dest);
          utext_replace_63(dest,iVar1,iVar1,this->fInputText->chunkContents + this->fAppendPosition,
                           (int)this->fInputLength - (int)this->fAppendPosition,status);
        }
        else {
          if (ut->pFuncs->mapNativeIndexToUTF16 == (UTextMapNativeIndexToUTF16 *)0x0) {
            destCapacity = (int)limit - (int)iVar1;
          }
          else {
            destCapacity = utext_extract_63(ut,iVar1,limit,(UChar *)0x0,0,status);
            *status = U_ZERO_ERROR;
          }
          dest_00 = (UChar *)uprv_malloc_63((long)destCapacity * 2);
          if (dest_00 == (UChar *)0x0) {
            this->fDeferredStatus = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            utext_extract_63(this->fInputText,this->fAppendPosition,this->fInputLength,dest_00,
                             destCapacity,status);
            iVar1 = utext_nativeLength_63(dest);
            utext_replace_63(dest,iVar1,iVar1,dest_00,destCapacity,status);
            uprv_free_63(dest_00);
          }
        }
      }
    }
    else {
      *status = this->fDeferredStatus;
    }
  }
  return dest;
}

Assistant:

UText *RegexMatcher::appendTail(UText *dest, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return dest;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return dest;
    }

    if (fInputLength > fAppendPosition) {
        if (UTEXT_FULL_TEXT_IN_CHUNK(fInputText, fInputLength)) {
            int64_t destLen = utext_nativeLength(dest);
            utext_replace(dest, destLen, destLen, fInputText->chunkContents+fAppendPosition,
                          (int32_t)(fInputLength-fAppendPosition), &status);
        } else {
            int32_t len16;
            if (UTEXT_USES_U16(fInputText)) {
                len16 = (int32_t)(fInputLength-fAppendPosition);
            } else {
                len16 = utext_extract(fInputText, fAppendPosition, fInputLength, NULL, 0, &status);
                status = U_ZERO_ERROR; // buffer overflow
            }

            UChar *inputChars = (UChar *)uprv_malloc(sizeof(UChar)*(len16));
            if (inputChars == NULL) {
                fDeferredStatus = U_MEMORY_ALLOCATION_ERROR;
            } else {
                utext_extract(fInputText, fAppendPosition, fInputLength, inputChars, len16, &status); // unterminated
                int64_t destLen = utext_nativeLength(dest);
                utext_replace(dest, destLen, destLen, inputChars, len16, &status);
                uprv_free(inputChars);
            }
        }
    }
    return dest;
}